

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

void __thiscall
OpenMD::SelectionEvaluator::compareProperty
          (SelectionEvaluator *this,StuntDouble *sd,SelectionSet *bs,int property,int comparator,
          float comparisonValue)

{
  double *pdVar1;
  ulong *puVar2;
  RealType RVar3;
  double dVar4;
  double dVar5;
  uint i;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Atom *atom;
  Atom *atom_00;
  _func_int **pp_Var9;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Vector3d pos;
  Vector3d local_68;
  undefined1 local_48 [16];
  double local_38 [3];
  
  local_68.super_Vector<double,_3U>.data_[0] = 0.0;
  local_68.super_Vector<double,_3U>.data_[1] = 0.0;
  local_68.super_Vector<double,_3U>.data_[2] = 0.0;
  switch(property) {
  case 0x1c00:
    dVar4 = sd->mass_;
    break;
  case 0x1c01:
    if (sd->objType_ < otRigidBody) {
      RVar3 = getCharge(this,(Atom *)sd);
      uVar11 = SUB84(RVar3,0);
      uVar12 = (undefined4)((ulong)RVar3 >> 0x20);
LAB_00229b4b:
      dVar4 = (double)CONCAT44(uVar12,uVar11);
    }
    else {
      dVar4 = 0.0;
      uVar11 = 0;
      uVar12 = 0;
      if (sd->objType_ == otRigidBody) {
        pp_Var9 = (_func_int **)sd[2].mass_;
        dVar4 = 0.0;
        if (pp_Var9 == sd[2].properties_._vptr_PropertyMap) {
          atom_00 = (Atom *)0x0;
        }
        else {
          atom_00 = (Atom *)*pp_Var9;
        }
        while (atom_00 != (Atom *)0x0) {
          pp_Var9 = pp_Var9 + 1;
          local_48._8_4_ = uVar11;
          local_48._0_8_ = dVar4;
          local_48._12_4_ = uVar12;
          RVar3 = getCharge(this,atom_00);
          if (pp_Var9 == sd[2].properties_._vptr_PropertyMap) {
            atom_00 = (Atom *)0x0;
          }
          else {
            atom_00 = (Atom *)*pp_Var9;
          }
          uVar11 = local_48._8_4_;
          uVar12 = local_48._12_4_;
          dVar4 = local_48._0_8_ + RVar3;
        }
      }
    }
    break;
  case 0x1c02:
    dVar4 = *(double *)
             (*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sd->storage_) +
             (long)sd->localIndex_ * 0x18);
    break;
  case 0x1c03:
    dVar4 = *(double *)
             (*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sd->storage_) + 8 +
             (long)sd->localIndex_ * 0x18);
    break;
  case 0x1c04:
    dVar4 = *(double *)
             (*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sd->storage_) + 0x10 +
             (long)sd->localIndex_ * 0x18);
    break;
  case 0x1c05:
    lVar6 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
    local_38[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)sd->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar6 + (long)sd->localIndex_ * 0x18);
    local_38[0] = *pdVar1;
    local_38[1] = pdVar1[1];
    dVar4 = 0.0;
    lVar6 = 0;
    do {
      dVar4 = dVar4 + local_38[lVar6] * local_38[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
      uVar11 = SUB84(dVar4,0);
      uVar12 = (undefined4)((ulong)dVar4 >> 0x20);
      goto LAB_00229b4b;
    }
    dVar4 = SQRT(dVar4);
    break;
  case 0x1c06:
    lVar6 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
    pdVar1 = (double *)(lVar6 + (long)sd->localIndex_ * 0x18);
    local_68.super_Vector<double,_3U>.data_[0] = *pdVar1;
    local_68.super_Vector<double,_3U>.data_[1] = pdVar1[1];
    local_68.super_Vector<double,_3U>.data_[2] =
         *(double *)(lVar6 + 0x10 + (long)sd->localIndex_ * 0x18);
    Snapshot::wrapVector(this->info->sman_->currentSnapshot_,&local_68);
    dVar4 = local_68.super_Vector<double,_3U>.data_[0];
    break;
  case 0x1c07:
    lVar6 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
    pdVar1 = (double *)(lVar6 + (long)sd->localIndex_ * 0x18);
    local_68.super_Vector<double,_3U>.data_[0] = *pdVar1;
    local_68.super_Vector<double,_3U>.data_[1] = pdVar1[1];
    local_68.super_Vector<double,_3U>.data_[2] =
         *(double *)(lVar6 + 0x10 + (long)sd->localIndex_ * 0x18);
    Snapshot::wrapVector(this->info->sman_->currentSnapshot_,&local_68);
    dVar4 = local_68.super_Vector<double,_3U>.data_[1];
    break;
  case 0x1c08:
    lVar6 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
    pdVar1 = (double *)(lVar6 + (long)sd->localIndex_ * 0x18);
    local_68.super_Vector<double,_3U>.data_[0] = *pdVar1;
    local_68.super_Vector<double,_3U>.data_[1] = pdVar1[1];
    local_68.super_Vector<double,_3U>.data_[2] =
         *(double *)(lVar6 + 0x10 + (long)sd->localIndex_ * 0x18);
    Snapshot::wrapVector(this->info->sman_->currentSnapshot_,&local_68);
    dVar4 = local_68.super_Vector<double,_3U>.data_[2];
    break;
  case 0x1c09:
    dVar4 = 0.0;
    if (sd->objType_ < otRigidBody) {
      dVar4 = (double)sd->globalIndex_;
    }
    break;
  default:
    unrecognizedAtomProperty(this,property);
    dVar4 = 0.0;
  }
  switch(comparator) {
  case 0x3400:
    bVar10 = dVar4 < (double)comparisonValue;
    break;
  case 0x3401:
    bVar10 = dVar4 < (double)comparisonValue;
    goto LAB_00229bcc;
  case 0x3402:
    dVar5 = (double)comparisonValue;
    goto LAB_00229ba7;
  case 0x3403:
    bVar10 = (double)comparisonValue < dVar4;
    break;
  case 0x3404:
    dVar4 = ABS(dVar4 - (double)comparisonValue);
    dVar5 = 1e-06;
LAB_00229ba7:
    bVar10 = dVar5 < dVar4;
LAB_00229bcc:
    bVar10 = !bVar10;
    goto LAB_00229be7;
  case 0x3405:
    bVar10 = dVar4 != (double)comparisonValue;
    goto LAB_00229be7;
  default:
    goto switchD_00229b6e_default;
  }
  bVar10 = !bVar10 && (double)comparisonValue != dVar4;
LAB_00229be7:
  if (bVar10) {
    uVar7 = (ulong)sd->globalIndex_;
    uVar8 = uVar7 + 0x3f;
    if (-1 < (long)uVar7) {
      uVar8 = uVar7;
    }
    puVar2 = (ulong *)(((long)uVar8 >> 6) * 8 +
                       *(long *)&(((bs->bitsets_).
                                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                 super__Bvector_base<std::allocator<bool>_> + -8 +
                      (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) * 8);
    *puVar2 = *puVar2 | 1L << ((byte)sd->globalIndex_ & 0x3f);
  }
switchD_00229b6e_default:
  return;
}

Assistant:

void SelectionEvaluator::compareProperty(StuntDouble* sd, SelectionSet& bs,
                                           int property, int comparator,
                                           float comparisonValue) {
    RealType propertyValue = 0.0;
    Vector3d pos;

    switch (property) {
    case Token::atomno:
      if (sd->isAtom()) {
        Atom* atom    = static_cast<Atom*>(sd);
        propertyValue = atom->getGlobalIndex();
      }
      break;
    case Token::mass:
      propertyValue = sd->getMass();
      break;
    case Token::charge:
      if (sd->isAtom()) {
        Atom* atom    = static_cast<Atom*>(sd);
        propertyValue = getCharge(atom);
      } else if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);
        RigidBody::AtomIterator ai;
        Atom* atom;
        for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
          propertyValue += getCharge(atom);
        }
      }
      break;
    case Token::x:
      propertyValue = sd->getPos().x();
      break;
    case Token::y:
      propertyValue = sd->getPos().y();
      break;
    case Token::z:
      propertyValue = sd->getPos().z();
      break;
    case Token::wrappedX:
      pos = sd->getPos();
      info->getSnapshotManager()->getCurrentSnapshot()->wrapVector(pos);
      propertyValue = pos.x();
      break;
    case Token::wrappedY:
      pos = sd->getPos();
      info->getSnapshotManager()->getCurrentSnapshot()->wrapVector(pos);
      propertyValue = pos.y();
      break;
    case Token::wrappedZ:
      pos = sd->getPos();
      info->getSnapshotManager()->getCurrentSnapshot()->wrapVector(pos);
      propertyValue = pos.z();
      break;
    case Token::r:
      propertyValue = sd->getPos().length();
      break;
    default:
      unrecognizedAtomProperty(property);
    }

    bool match = false;
    switch (comparator) {
    case Token::opLT:
      match = propertyValue < comparisonValue;
      break;
    case Token::opLE:
      match = propertyValue <= comparisonValue;
      break;
    case Token::opGE:
      match = propertyValue >= comparisonValue;
      break;
    case Token::opGT:
      match = propertyValue > comparisonValue;
      break;
    case Token::opEQ:
      match = fabs(propertyValue - comparisonValue) <= OpenMD::epsilon;
      break;
    case Token::opNE:
      match = propertyValue != comparisonValue;
      break;
    }

    if (match) bs.bitsets_[STUNTDOUBLE].setBitOn(sd->getGlobalIndex());
  }